

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O3

void __thiscall
preciseunitOps_flagClearSetIflag_Test::TestBody(preciseunitOps_flagClearSetIflag_Test *this)

{
  int iVar1;
  unit_data uVar2;
  char *in_R9;
  precise_unit m2;
  precise_unit m1;
  AssertHelper local_80;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  internal local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  string local_60;
  double local_40;
  undefined8 local_38;
  double local_30;
  undefined8 local_28;
  double local_20;
  
  local_30 = 0.224028;
  local_28 = 1;
  local_38._0_4_ = units::detail::unit_data::add_i_flag((unit_data *)&local_28);
  local_38._4_4_ = local_28._4_4_;
  local_40 = 0.224028;
  local_70[0] = SUB41(((uint)local_38._0_4_ & 0x20000000) >> 0x1d,0);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (((uint)local_38._0_4_ & 0x20000000) == 0) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,local_70,(AssertionResult *)"m2.has_i_flag()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x29b,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
  }
  if ((local_38._0_4_ == local_28._0_4_) && (local_28._4_4_ == local_38._4_4_)) {
    local_70[0] = (internal)(local_30 != local_40);
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((local_30 == local_40) && (!NAN(local_30) && !NAN(local_40))) {
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_60,local_70,(AssertionResult *)"m1.is_exactly_the_same(m2)","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x29c,local_60._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (local_78._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_78._M_head_impl + 8))();
      }
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68,local_68);
      }
    }
  }
  local_20 = local_40;
  uVar2 = units::detail::unit_data::clear_i_flag((unit_data *)&local_38);
  iVar1 = local_38._4_4_;
  local_70[0] = (internal)(((uint)uVar2 >> 0x1d & 1) == 0);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_70[0]) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,local_70,(AssertionResult *)"m3.has_i_flag()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x29e,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
  }
  if ((uVar2 == local_28._0_4_) && (local_28._4_4_ == iVar1)) {
    local_70[0] = (internal)(local_20 == local_30);
    if ((local_30 == local_20) && (!NAN(local_30) && !NAN(local_20))) goto LAB_0013ecb4;
  }
  else {
    local_70[0] = (internal)0x0;
  }
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::Message::Message((Message *)&local_78);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_60,local_70,(AssertionResult *)"m1.is_exactly_the_same(m3)","false","true",in_R9
            );
  testing::internal::AssertHelper::AssertHelper
            (&local_80,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
             ,0x29f,local_60._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_78._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_78._M_head_impl + 8))();
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
LAB_0013ecb4:
  iVar1 = local_38._4_4_;
  uVar2 = (unit_data)((uint)local_38._0_4_ & 0xfffffff);
  local_38 = CONCAT44(local_38._4_4_,local_38._0_4_) & 0xffffffff0fffffff;
  if ((local_28._0_4_ == uVar2) && (iVar1 == local_28._4_4_)) {
    local_70[0] = (internal)(local_40 == local_30);
    if ((local_40 == local_30) && (!NAN(local_40) && !NAN(local_30))) {
      return;
    }
  }
  else {
    local_70[0] = (internal)0x0;
  }
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::Message::Message((Message *)&local_78);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_60,local_70,(AssertionResult *)"m2.is_exactly_the_same(m1)","false","true",in_R9
            );
  testing::internal::AssertHelper::AssertHelper
            (&local_80,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
             ,0x2a1,local_60._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_78._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_78._M_head_impl + 8))();
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  return;
}

Assistant:

TEST(preciseunitOps, flagClearSetIflag)
{
    precise_unit m1(0.245, precise::yd);
    auto m2 = m1.add_i_flag();
    EXPECT_TRUE(m2.has_i_flag());
    EXPECT_FALSE(m1.is_exactly_the_same(m2));
    auto m3 = m2.clear_i_flag();
    EXPECT_FALSE(m3.has_i_flag());
    EXPECT_TRUE(m1.is_exactly_the_same(m3));
    m2.clear_flags();
    EXPECT_TRUE(m2.is_exactly_the_same(m1));
}